

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

fdb_compact_decision
cb_inmem_snap(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc_in,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  void **value_out_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  void *in_stack_00000008;
  cb_inmem_snap_args *args;
  fdb_compact_decision ret;
  fdb_status s;
  fdb_doc *doc;
  fdb_iterator *fit;
  fdb_kvs_info info;
  fdb_kvs_handle *snap;
  size_t valuelen;
  void *value_out;
  char value [256];
  char key [256];
  int idx;
  int c;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 in_stack_fffffffffffffcdc;
  fdb_iterator *in_stack_fffffffffffffce8;
  size_t *psVar6;
  size_t *valuelen_out;
  char *keylen;
  void *key_00;
  fdb_compact_decision fVar7;
  undefined4 in_stack_fffffffffffffd1c;
  fdb_iterator *local_2d8 [2];
  long local_2c8;
  fdb_doc **in_stack_fffffffffffffd50;
  fdb_iterator *in_stack_fffffffffffffd58;
  fdb_kvs_handle *local_2a0;
  size_t local_298;
  undefined8 local_290;
  char local_288 [200];
  fdb_kvs_info *in_stack_fffffffffffffe40;
  fdb_kvs_handle *in_stack_fffffffffffffe48;
  size_t local_188 [32];
  uint local_88;
  uint local_84;
  fdb_seqnum_t in_stack_ffffffffffffff80;
  fdb_kvs_handle **in_stack_ffffffffffffff88;
  fdb_kvs_handle *in_stack_ffffffffffffff90;
  timeval local_40 [2];
  long local_20;
  long local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  gettimeofday(local_40,(__timezone_ptr_t)0x0);
  fVar7 = 0;
  if (local_c == 2) {
    key_00 = in_stack_00000008;
    if (local_18 == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x5d0);
      cb_inmem_snap::__test_pass = 0;
      key_00 = in_stack_00000008;
      if (local_18 == 0) {
        __assert_fail("kv_name",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5d0,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    if ((*(byte *)(local_20 + 0x48) & 1) != 0) {
      fVar7 = 1;
    }
    *(int *)((long)key_00 + 0xc) = *(int *)((long)key_00 + 0xc) + 1;
    if (*(int *)((long)key_00 + 0xc) == 2) {
      fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5d8);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5d8,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5db);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5db,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      if (local_2c8 != *(int *)((long)key_00 + 8)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5dc);
        cb_inmem_snap::__test_pass = 0;
        if (local_2c8 != *(int *)((long)key_00 + 8)) {
          __assert_fail("info.last_seqnum == (fdb_seqnum_t)args->n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5dc,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      uVar4 = 0;
      uVar5 = 0;
      fVar1 = fdb_iterator_init(local_2a0,local_2d8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5df);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5df,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      local_84 = 0;
      do {
        fVar1 = fdb_iterator_get(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        local_88 = local_84;
        sprintf((char *)local_188,*(char **)((long)key_00 + 0x18),(ulong)local_84);
        memset(local_288,0x78,(long)*(int *)((long)key_00 + 0x10));
        builtin_strncpy(local_288 + (long)*(int *)((long)key_00 + 0x10) + -6,"<end>",6);
        sprintf(local_288,*(char **)((long)key_00 + 0x20),(ulong)local_88);
        iVar2 = memcmp(pvRam0000000000000020,local_188,sRam0000000000000000);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_188,
                  pvRam0000000000000020,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x5ed);
          cb_inmem_snap::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5ed,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        iVar2 = memcmp(pvRam0000000000000040,local_288,sRam0000000000000010);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_288,
                  pvRam0000000000000040,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x5ee);
          cb_inmem_snap::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5ee,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        local_84 = local_84 + 1;
        fdb_doc_free((fdb_doc *)0x10e342);
        fVar1 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffcdc,CONCAT22(uVar5,uVar4)));
      } while (fVar1 == FDB_RESULT_SUCCESS);
      if (local_84 != *(uint *)((long)key_00 + 8)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5f3);
        cb_inmem_snap::__test_pass = 0;
        if (local_84 != *(uint *)((long)key_00 + 8)) {
          __assert_fail("c == args->n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5f3,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_iterator_close(in_stack_fffffffffffffce8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5f6);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5f6,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffcdc,CONCAT22(uVar5,uVar4)));
    }
    else if (*(int *)((long)key_00 + 0xc) == 5) {
      sprintf((char *)local_188,"new_key");
      sprintf(local_288,"new_value");
      valuelen_out = local_188;
      sVar3 = strlen((char *)local_188);
      value_out_00 = (void **)(sVar3 + 1);
      keylen = local_288;
      strlen(local_288);
      fVar1 = fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffd1c,fVar7),key_00,
                         (size_t)keylen,value_out_00,(size_t)valuelen_out);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5ff);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5ff,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x603);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x603,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x606);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x606,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      if (local_2c8 != (long)*(int *)((long)key_00 + 8) + 1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x607);
        cb_inmem_snap::__test_pass = 0;
        if (local_2c8 != (long)*(int *)((long)key_00 + 8) + 1) {
          __assert_fail("info.last_seqnum == (fdb_seqnum_t)args->n+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x607,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      uVar4 = 0;
      uVar5 = 0;
      fVar1 = fdb_iterator_init(local_2a0,local_2d8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x60a);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x60a,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      local_84 = 0;
      do {
        fVar1 = fdb_iterator_get(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        if ((int)local_84 < *(int *)((long)key_00 + 8)) {
          local_88 = local_84;
          sprintf((char *)local_188,*(char **)((long)key_00 + 0x18),(ulong)local_84);
          memset(local_288,0x78,(long)*(int *)((long)key_00 + 0x10));
          builtin_strncpy(local_288 + (long)*(int *)((long)key_00 + 0x10) + -6,"<end>",6);
          sprintf(local_288,*(char **)((long)key_00 + 0x20),(ulong)local_88);
          iVar2 = memcmp(pvRam0000000000000020,local_188,sRam0000000000000000);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_188,
                    pvRam0000000000000020,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x619);
            cb_inmem_snap::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x619,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
          iVar2 = memcmp(pvRam0000000000000040,local_288,sRam0000000000000010);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_288,
                    pvRam0000000000000040,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x61a);
            cb_inmem_snap::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x61a,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        else {
          sprintf((char *)local_188,"new_key");
          sprintf(local_288,"new_value");
          iVar2 = memcmp(pvRam0000000000000020,local_188,sRam0000000000000000);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_188,
                    pvRam0000000000000020,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x61f);
            cb_inmem_snap::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x61f,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
          iVar2 = memcmp(pvRam0000000000000040,local_288,sRam0000000000000010);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_288,
                    pvRam0000000000000040,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x620);
            cb_inmem_snap::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x620,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        local_84 = local_84 + 1;
        fdb_doc_free((fdb_doc *)0x10ea7a);
        fVar1 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffcdc,CONCAT22(uVar5,uVar4)));
      } while (fVar1 == FDB_RESULT_SUCCESS);
      if (local_84 != *(int *)((long)key_00 + 8) + 1U) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x626);
        cb_inmem_snap::__test_pass = 0;
        if (local_84 != *(int *)((long)key_00 + 8) + 1U) {
          __assert_fail("c == args->n + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x626,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_iterator_close(in_stack_fffffffffffffce8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x629);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x629,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        fVar1 = FDB_RESULT_SUCCESS;
      }
      psVar6 = local_188;
      strlen((char *)local_188);
      fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(fVar1,fVar7),key_00,(size_t)keylen,value_out_00,
                         valuelen_out);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x62c);
        cb_inmem_snap::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x62c,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      iVar2 = memcmp(local_290,local_288,local_298);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_288,local_290,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x62d,uVar4,local_2a0,psVar6);
        cb_inmem_snap::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x62d,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fdb_free_block((void *)0x10ecb4);
      fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffcdc,CONCAT22(uVar5,uVar4)));
    }
  }
  return fVar7;
}

Assistant:

static fdb_compact_decision cb_inmem_snap(fdb_file_handle *fhandle,
                            fdb_compaction_status status,
                            const char *kv_name,
                            fdb_doc *doc_in, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    int c, idx;
    char key[256], value[256];
    void *value_out;
    size_t valuelen;
    fdb_kvs_handle *snap;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_inmem_snap_args *args = (struct cb_inmem_snap_args *)ctx;
    (void)args;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        if (doc_in->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        args->move_count++;
        if (args->move_count == 2) {
            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                idx = c;
                sprintf(key, args->keystr, idx);
                memset(value, 'x', args->value_len);
                memcpy(value + args->value_len - 6, "<end>", 6);
                sprintf(value, args->valuestr, idx);
                TEST_CMP(doc->key, key, doc->keylen);
                TEST_CMP(doc->body, value, doc->bodylen);

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            fdb_kvs_close(snap);

        } else if (args->move_count == 5) {
            // insert new doc
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            s = fdb_set_kv(args->handle, (void*)key, strlen(key)+1, (void*)value, strlen(value)+1);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n+1);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                if (c < args->n) {
                    idx = c;
                    sprintf(key, args->keystr, idx);
                    memset(value, 'x', args->value_len);
                    memcpy(value + args->value_len - 6, "<end>", 6);
                    sprintf(value, args->valuestr, idx);
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                } else {
                    // new document
                    sprintf(key, "new_key");
                    sprintf(value, "new_value");
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                }

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n + 1);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CMP(value_out, value, valuelen);
            fdb_free_block(value_out);

            fdb_kvs_close(snap);
        }
    }
    return ret;
}